

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

AcceptOnPropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AcceptOnPropertyExprSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::PropertyExprSyntax&>
          (BumpAllocator *this,Token *args,Token *args_1,ExpressionSyntax *args_2,Token *args_3,
          PropertyExprSyntax *args_4)

{
  Token openParen;
  Token keyword;
  Token closeParen;
  AcceptOnPropertyExprSyntax *condition;
  PropertyExprSyntax *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  Info *in_R8;
  undefined8 in_R9;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  condition = (AcceptOnPropertyExprSyntax *)
              allocate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
                      );
  keyword.info = (Info *)*in_RSI;
  keyword._0_8_ = in_RDX[1];
  openParen.info = (Info *)*in_RDX;
  openParen._0_8_ = in_R8->location;
  closeParen.info = in_R8;
  closeParen.kind = (short)in_R9;
  closeParen._2_1_ = (char)((ulong)in_R9 >> 0x10);
  closeParen.numFlags.raw = (char)((ulong)in_R9 >> 0x18);
  closeParen.rawLen = (int)((ulong)in_R9 >> 0x20);
  slang::syntax::AcceptOnPropertyExprSyntax::AcceptOnPropertyExprSyntax
            ((AcceptOnPropertyExprSyntax *)in_R8->rawTextPtr,keyword,openParen,
             (ExpressionSyntax *)condition,closeParen,in_RCX);
  return condition;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }